

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void tree_print_choice_content
               (lyout *out,lys_module *module,int level,uint64_t indent,uint max_name_len,
               lys_node *node,int mask,int spec_config)

{
  lys_node *plVar1;
  lys_node *node_local;
  uint max_name_len_local;
  uint64_t indent_local;
  int level_local;
  lys_module *module_local;
  lyout *out_local;
  
  plVar1 = lys_is_disabled(node,0);
  if ((plVar1 == (lys_node *)0x0) && ((node->nodetype & mask) != LYS_UNKNOWN)) {
    if (node->nodetype == LYS_CASE) {
      tree_print_case(out,module,level,indent,max_name_len,node,0,spec_config,(lys_node *)0x0);
    }
    else {
      tree_print_case(out,module,level,indent,max_name_len,node,1,spec_config,(lys_node *)0x0);
    }
  }
  return;
}

Assistant:

static void
tree_print_choice_content(struct lyout *out, const struct lys_module *module, int level, uint64_t indent,
                          unsigned int max_name_len, const struct lys_node *node, int mask, int spec_config)
{
    if (lys_is_disabled(node, 0)) {
        return;
    }

    if (node->nodetype & mask) {
        if (node->nodetype == LYS_CASE) {
            tree_print_case(out, module, level, indent, max_name_len, node, 0, spec_config, NULL);
        } else {
            tree_print_case(out, module, level, indent, max_name_len, node, 1, spec_config, NULL);
        }
    }
}